

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ark_brusselator1D_manyvec.c
# Opt level: O0

int main(void)

{
  int iVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  SUNContext ctx;
  long netf;
  long ncfn;
  long nni;
  long nfeLS;
  long nJv;
  long nlcf;
  long nli;
  long nsetups;
  long nfi;
  long nfe;
  long nst_a;
  long nst;
  int iout;
  FILE *WFID;
  FILE *VFID;
  FILE *UFID;
  FILE *FID;
  sunrealtype wnorm;
  sunrealtype vnorm;
  sunrealtype unorm;
  sunrealtype tout;
  sunrealtype dTout;
  sunrealtype t;
  sunrealtype pi;
  void *arkode_mem;
  SUNLinearSolver LS;
  N_Vector uvw [3];
  N_Vector w;
  N_Vector v;
  N_Vector u;
  N_Vector y;
  int flag;
  sunindextype i;
  sunrealtype abstol;
  sunrealtype reltol;
  sunrealtype ep;
  sunrealtype dw;
  sunrealtype dv;
  sunrealtype du;
  sunrealtype b;
  sunrealtype a;
  sunindextype N;
  sunrealtype *wdata;
  sunrealtype *vdata;
  sunrealtype *udata;
  UserData userdata;
  int Nvar;
  int Nt;
  sunrealtype Tf;
  sunrealtype T0;
  int in_stack_fffffffffffffe2c;
  char *in_stack_fffffffffffffe30;
  void *in_stack_fffffffffffffe38;
  undefined8 local_1b0;
  undefined8 local_1a8;
  undefined8 local_1a0;
  undefined8 local_198;
  undefined8 local_190;
  undefined8 local_188;
  undefined8 local_180;
  undefined8 local_178;
  undefined8 local_170;
  undefined8 local_168;
  undefined8 local_160;
  undefined8 local_158;
  undefined8 local_150;
  int local_144;
  FILE *local_140;
  FILE *local_138;
  FILE *local_130;
  FILE *local_128;
  double local_120;
  double local_118;
  double local_110;
  char *local_108;
  double local_100;
  double local_f8;
  double local_f0;
  undefined8 local_e8;
  undefined8 local_e0;
  undefined8 local_d8;
  undefined8 local_d0;
  undefined8 local_c8;
  undefined8 local_b8;
  undefined8 local_b0;
  undefined8 local_a8;
  undefined8 local_a0;
  int local_94;
  long local_90;
  undefined8 local_88;
  undefined8 local_80;
  long local_78;
  long local_70;
  long local_68;
  long local_60;
  double local_58;
  void *local_50;
  long local_48;
  long local_40;
  long local_38;
  long local_30;
  long *local_28;
  int local_20;
  int local_1c;
  char *local_18;
  double local_10;
  int local_4;
  
  local_4 = 0;
  local_10 = 0.0;
  local_18 = (char *)0x4024000000000000;
  local_1c = 100;
  local_20 = 3;
  local_28 = (long *)0x0;
  local_48 = 0xc9;
  local_50 = (void *)0x3fe3333333333333;
  local_58 = 2.0;
  local_60 = 0x3f50624dd2f1a9fc;
  local_68 = 0x3f50624dd2f1a9fc;
  local_70 = 0x3f50624dd2f1a9fc;
  local_78 = 0x3ee4f8b588e368f1;
  local_80 = 0x3eb0c6f7a0b5ed8d;
  local_88 = 0x3ddb7cdfd9d7bdbb;
  local_a0 = 0;
  local_a8 = 0;
  local_b0 = 0;
  local_b8 = 0;
  local_e0 = 0;
  local_e8 = 0;
  local_94 = SUNContext_Create(0,&local_1b0);
  iVar1 = check_flag(in_stack_fffffffffffffe38,in_stack_fffffffffffffe30,in_stack_fffffffffffffe2c);
  if (iVar1 == 0) {
    local_28 = (long *)malloc(0x40);
    iVar1 = check_flag(in_stack_fffffffffffffe38,in_stack_fffffffffffffe30,in_stack_fffffffffffffe2c
                      );
    if (iVar1 == 0) {
      *local_28 = local_48;
      local_28[2] = (long)local_50;
      local_28[3] = (long)local_58;
      local_28[4] = local_60;
      local_28[5] = local_68;
      local_28[6] = local_70;
      local_28[7] = local_78;
      printf("\n1D Brusselator PDE test problem:\n");
      printf("    N = %li\n",*local_28);
      printf("    problem parameters:  a = %g,  b = %g,  ep = %g\n",local_28[2],local_28[3],
             local_28[7]);
      printf("    diffusion coefficients:  du = %g,  dv = %g,  dw = %g\n",local_28[4],local_28[5],
             local_28[6]);
      printf("    reltol = %.1e,  abstol = %.1e\n\n",local_80,local_88);
      local_28[1] = (long)(1.0 / (double)(local_48 + -1));
      local_a8 = N_VNew_Serial(local_48,local_1b0);
      iVar1 = check_flag(in_stack_fffffffffffffe38,in_stack_fffffffffffffe30,
                         in_stack_fffffffffffffe2c);
      if (iVar1 == 0) {
        local_b0 = N_VClone(local_a8);
        iVar1 = check_flag(in_stack_fffffffffffffe38,in_stack_fffffffffffffe30,
                           in_stack_fffffffffffffe2c);
        if (iVar1 == 0) {
          local_b8 = N_VClone(local_a8);
          iVar1 = check_flag(in_stack_fffffffffffffe38,in_stack_fffffffffffffe30,
                             in_stack_fffffffffffffe2c);
          if (iVar1 == 0) {
            local_d8 = local_a8;
            local_d0 = local_b0;
            local_c8 = local_b8;
            local_a0 = N_VNew_ManyVector((long)local_20,&local_d8,local_1b0);
            iVar1 = check_flag(in_stack_fffffffffffffe38,in_stack_fffffffffffffe30,
                               in_stack_fffffffffffffe2c);
            if (iVar1 == 0) {
              local_30 = N_VGetArrayPointer(local_a8);
              iVar1 = check_flag(in_stack_fffffffffffffe38,in_stack_fffffffffffffe30,
                                 in_stack_fffffffffffffe2c);
              if (iVar1 == 0) {
                local_38 = N_VGetArrayPointer(local_b0);
                iVar1 = check_flag(in_stack_fffffffffffffe38,in_stack_fffffffffffffe30,
                                   in_stack_fffffffffffffe2c);
                if (iVar1 == 0) {
                  local_40 = N_VGetArrayPointer(local_b8);
                  iVar1 = check_flag(in_stack_fffffffffffffe38,in_stack_fffffffffffffe30,
                                     in_stack_fffffffffffffe2c);
                  if (iVar1 == 0) {
                    local_f0 = atan(1.0);
                    local_f0 = local_f0 * 4.0;
                    for (local_90 = 0; local_90 < local_48; local_90 = local_90 + 1) {
                      in_stack_fffffffffffffe38 = local_50;
                      dVar2 = sin(local_f0 * (double)local_90 * (double)local_28[1]);
                      *(double *)(local_30 + local_90 * 8) =
                           dVar2 * 0.1 + (double)in_stack_fffffffffffffe38;
                      dVar3 = local_58 / (double)local_50;
                      dVar4 = sin(local_f0 * (double)local_90 * (double)local_28[1]);
                      dVar2 = local_58;
                      *(double *)(local_38 + local_90 * 8) = dVar4 * 0.1 + dVar3;
                      dVar3 = sin(local_f0 * (double)local_90 * (double)local_28[1]);
                      *(double *)(local_40 + local_90 * 8) = dVar3 * 0.1 + dVar2;
                    }
                    local_e8 = ARKStepCreate(local_10,fe,fi,local_a0,local_1b0);
                    iVar1 = check_flag(in_stack_fffffffffffffe38,in_stack_fffffffffffffe30,
                                       in_stack_fffffffffffffe2c);
                    if (iVar1 == 0) {
                      local_94 = ARKodeSetUserData(local_e8,local_28);
                      iVar1 = check_flag(in_stack_fffffffffffffe38,in_stack_fffffffffffffe30,
                                         in_stack_fffffffffffffe2c);
                      if (iVar1 == 0) {
                        local_94 = ARKodeSStolerances(local_80,local_88,local_e8);
                        iVar1 = check_flag(in_stack_fffffffffffffe38,in_stack_fffffffffffffe30,
                                           in_stack_fffffffffffffe2c);
                        if (iVar1 == 0) {
                          local_e0 = SUNLinSol_SPGMR(local_a0,0,10,local_1b0);
                          iVar1 = check_flag(in_stack_fffffffffffffe38,in_stack_fffffffffffffe30,
                                             in_stack_fffffffffffffe2c);
                          if (iVar1 == 0) {
                            local_94 = ARKodeSetLinearSolver(local_e8,local_e0,0);
                            iVar1 = check_flag(in_stack_fffffffffffffe38,in_stack_fffffffffffffe30,
                                               in_stack_fffffffffffffe2c);
                            if (iVar1 == 0) {
                              local_94 = ARKodeSetJacTimes(local_e8,0,JacVI);
                              iVar1 = check_flag(in_stack_fffffffffffffe38,in_stack_fffffffffffffe30
                                                 ,in_stack_fffffffffffffe2c);
                              if (iVar1 == 0) {
                                local_128 = fopen("bruss_mesh.txt","w");
                                for (local_90 = 0; local_90 < local_48; local_90 = local_90 + 1) {
                                  fprintf(local_128,"  %.16e\n",
                                          (double)local_28[1] * (double)local_90);
                                }
                                fclose(local_128);
                                local_130 = fopen("bruss_u.txt","w");
                                local_138 = fopen("bruss_v.txt","w");
                                local_140 = fopen("bruss_w.txt","w");
                                for (local_90 = 0; local_90 < local_48; local_90 = local_90 + 1) {
                                  fprintf(local_130," %.16e",
                                          *(undefined8 *)(local_30 + local_90 * 8));
                                }
                                for (local_90 = 0; local_90 < local_48; local_90 = local_90 + 1) {
                                  fprintf(local_138," %.16e",
                                          *(undefined8 *)(local_38 + local_90 * 8));
                                }
                                for (local_90 = 0; local_90 < local_48; local_90 = local_90 + 1) {
                                  fprintf(local_140," %.16e",
                                          *(undefined8 *)(local_40 + local_90 * 8));
                                }
                                fprintf(local_130,"\n");
                                fprintf(local_138,"\n");
                                fprintf(local_140,"\n");
                                local_f8 = local_10;
                                local_100 = ((double)local_18 - local_10) / (double)local_1c;
                                local_108 = (char *)(local_10 + local_100);
                                printf("        t      ||u||_rms   ||v||_rms   ||w||_rms\n");
                                printf("   ----------------------------------------------\n");
                                for (local_144 = 0; local_144 < local_1c; local_144 = local_144 + 1)
                                {
                                  local_94 = ARKodeEvolve(local_108,local_e8,local_a0,&local_f8,1);
                                  iVar1 = check_flag(in_stack_fffffffffffffe38,
                                                     in_stack_fffffffffffffe30,
                                                     in_stack_fffffffffffffe2c);
                                  if (iVar1 != 0) break;
                                  local_110 = (double)N_VDotProd(local_a8,local_a8);
                                  local_110 = sqrt(local_110 / (double)local_48);
                                  local_118 = (double)N_VDotProd(local_b0,local_b0);
                                  local_118 = sqrt(local_118 / (double)local_48);
                                  local_120 = (double)N_VDotProd(local_b8,local_b8);
                                  local_120 = sqrt(local_120 / (double)local_48);
                                  printf("  %10.6f  %10.6f  %10.6f  %10.6f\n",local_f8,local_110,
                                         local_118,local_120);
                                  if (local_94 < 0) {
                                    fprintf(_stderr,"Solver failure, stopping integration\n");
                                    break;
                                  }
                                  in_stack_fffffffffffffe30 =
                                       (char *)(local_100 + (double)local_108);
                                  if ((double)local_18 < (double)in_stack_fffffffffffffe30) {
                                    in_stack_fffffffffffffe30 = local_18;
                                  }
                                  local_108 = in_stack_fffffffffffffe30;
                                  for (local_90 = 0; local_90 < local_48; local_90 = local_90 + 1) {
                                    fprintf(local_130," %.16e",
                                            *(undefined8 *)(local_30 + local_90 * 8));
                                  }
                                  for (local_90 = 0; local_90 < local_48; local_90 = local_90 + 1) {
                                    fprintf(local_138," %.16e",
                                            *(undefined8 *)(local_38 + local_90 * 8));
                                  }
                                  for (local_90 = 0; local_90 < local_48; local_90 = local_90 + 1) {
                                    fprintf(local_140," %.16e",
                                            *(undefined8 *)(local_40 + local_90 * 8));
                                  }
                                  fprintf(local_130,"\n");
                                  fprintf(local_138,"\n");
                                  fprintf(local_140,"\n");
                                }
                                printf("   ----------------------------------------------\n");
                                fclose(local_130);
                                fclose(local_138);
                                fclose(local_140);
                                local_94 = ARKodeGetNumSteps(local_e8,&local_150);
                                check_flag(in_stack_fffffffffffffe38,in_stack_fffffffffffffe30,
                                           in_stack_fffffffffffffe2c);
                                local_94 = ARKodeGetNumStepAttempts(local_e8,&local_158);
                                check_flag(in_stack_fffffffffffffe38,in_stack_fffffffffffffe30,
                                           in_stack_fffffffffffffe2c);
                                local_94 = ARKStepGetNumRhsEvals(local_e8,&local_160,&local_168);
                                check_flag(in_stack_fffffffffffffe38,in_stack_fffffffffffffe30,
                                           in_stack_fffffffffffffe2c);
                                local_94 = ARKodeGetNumLinSolvSetups(local_e8,&local_170);
                                check_flag(in_stack_fffffffffffffe38,in_stack_fffffffffffffe30,
                                           in_stack_fffffffffffffe2c);
                                local_94 = ARKodeGetNumErrTestFails(local_e8,&local_1a8);
                                check_flag(in_stack_fffffffffffffe38,in_stack_fffffffffffffe30,
                                           in_stack_fffffffffffffe2c);
                                local_94 = ARKodeGetNumNonlinSolvIters(local_e8,&local_198);
                                check_flag(in_stack_fffffffffffffe38,in_stack_fffffffffffffe30,
                                           in_stack_fffffffffffffe2c);
                                local_94 = ARKodeGetNumNonlinSolvConvFails(local_e8,&local_1a0);
                                check_flag(in_stack_fffffffffffffe38,in_stack_fffffffffffffe30,
                                           in_stack_fffffffffffffe2c);
                                local_94 = ARKodeGetNumLinIters(local_e8,&local_178);
                                check_flag(in_stack_fffffffffffffe38,in_stack_fffffffffffffe30,
                                           in_stack_fffffffffffffe2c);
                                local_94 = ARKodeGetNumLinConvFails(local_e8,&local_180);
                                check_flag(in_stack_fffffffffffffe38,in_stack_fffffffffffffe30,
                                           in_stack_fffffffffffffe2c);
                                local_94 = ARKodeGetNumJtimesEvals(local_e8,&local_188);
                                check_flag(in_stack_fffffffffffffe38,in_stack_fffffffffffffe30,
                                           in_stack_fffffffffffffe2c);
                                local_94 = ARKodeGetNumLinRhsEvals(local_e8,&local_190);
                                check_flag(in_stack_fffffffffffffe38,in_stack_fffffffffffffe30,
                                           in_stack_fffffffffffffe2c);
                                printf("\nFinal Solver Statistics:\n");
                                printf("   Internal solver steps = %li (attempted = %li)\n",
                                       local_150,local_158);
                                printf("   Total RHS evals:  Fe = %li,  Fi = %li\n",local_160,
                                       local_168);
                                printf("   Total linear solver setups = %li\n",local_170);
                                printf("   Total linear iterations = %li\n",local_178);
                                printf("   Total linear convergence failures = %li\n",local_180);
                                printf("   Total J*v evaluations = %li\n",local_188);
                                printf("   Total RHS evals in linear solver = %li\n",local_190);
                                printf("   Total number of Newton iterations = %li\n",local_198);
                                printf("   Total number of nonlinear solver convergence failures = %li\n"
                                       ,local_1a0);
                                printf("   Total number of error test failures = %li\n\n",local_1a8)
                                ;
                                N_VDestroy(local_a0);
                                N_VDestroy(local_a8);
                                N_VDestroy(local_b0);
                                N_VDestroy(local_b8);
                                free(local_28);
                                ARKodeFree(&local_e8);
                                SUNLinSolFree(local_e0);
                                SUNContext_Free(&local_1b0);
                                local_4 = 0;
                              }
                              else {
                                local_4 = 1;
                              }
                            }
                            else {
                              local_4 = 1;
                            }
                          }
                          else {
                            local_4 = 1;
                          }
                        }
                        else {
                          local_4 = 1;
                        }
                      }
                      else {
                        local_4 = 1;
                      }
                    }
                    else {
                      local_4 = 1;
                    }
                  }
                  else {
                    local_4 = 1;
                  }
                }
                else {
                  local_4 = 1;
                }
              }
              else {
                local_4 = 1;
              }
            }
            else {
              local_4 = 1;
            }
          }
          else {
            local_4 = 1;
          }
        }
        else {
          local_4 = 1;
        }
      }
      else {
        local_4 = 1;
      }
    }
    else {
      local_4 = 1;
    }
  }
  else {
    local_4 = 1;
  }
  return local_4;
}

Assistant:

int main(void)
{
  /* general problem parameters */
  sunrealtype T0    = ZERO;             /* initial time */
  sunrealtype Tf    = SUN_RCONST(10.0); /* final time */
  int Nt            = 100;              /* total number of output times */
  int Nvar          = 3;                /* number of solution fields */
  UserData userdata = NULL;
  sunrealtype *udata, *vdata, *wdata;
  sunindextype N     = 201;             /* spatial mesh size */
  sunrealtype a      = SUN_RCONST(0.6); /* problem parameters */
  sunrealtype b      = SUN_RCONST(2.0);
  sunrealtype du     = SUN_RCONST(0.001);
  sunrealtype dv     = SUN_RCONST(0.001);
  sunrealtype dw     = SUN_RCONST(0.001);
  sunrealtype ep     = SUN_RCONST(1.0e-5); /* stiffness parameter */
  sunrealtype reltol = SUN_RCONST(1.0e-6); /* tolerances */
  sunrealtype abstol = SUN_RCONST(1.0e-10);
  sunindextype i;

  /* general problem variables */
  int flag;          /* reusable error-checking flag */
  N_Vector y = NULL; /* empty manyvector for storing solution */
  N_Vector u = NULL; /* empty vectors for storing solution components */
  N_Vector v = NULL;
  N_Vector w = NULL;
  N_Vector uvw[3]; /* vector array composed of u,v,w component vectors */
  SUNLinearSolver LS = NULL; /* empty linear solver object */
  void* arkode_mem   = NULL; /* empty ARKode memory structure */
  sunrealtype pi, t, dTout, tout, unorm, vnorm, wnorm;
  FILE *FID, *UFID, *VFID, *WFID;
  int iout;
  long int nst, nst_a, nfe, nfi, nsetups, nli, nlcf, nJv, nfeLS, nni, ncfn, netf;

  /* Create the SUNDIALS context object for this simulation */
  SUNContext ctx;
  flag = SUNContext_Create(SUN_COMM_NULL, &ctx);
  if (check_flag(&flag, "SUNContext_Create", 1)) { return 1; }

  /* allocate udata structure */
  userdata = (UserData)malloc(sizeof(*userdata));
  if (check_flag((void*)userdata, "malloc", 2)) { return 1; }

  /* store the inputs in the UserData structure */
  userdata->N  = N;
  userdata->a  = a;
  userdata->b  = b;
  userdata->du = du;
  userdata->dv = dv;
  userdata->dw = dw;
  userdata->ep = ep;

  /* Initial problem output */
  printf("\n1D Brusselator PDE test problem:\n");
  printf("    N = %li\n", (long int)userdata->N);
  printf("    problem parameters:  a = %" GSYM ",  b = %" GSYM ",  ep = %" GSYM
         "\n",
         userdata->a, userdata->b, userdata->ep);
  printf("    diffusion coefficients:  du = %" GSYM ",  dv = %" GSYM
         ",  dw = %" GSYM "\n",
         userdata->du, userdata->dv, userdata->dw);
  printf("    reltol = %.1" ESYM ",  abstol = %.1" ESYM "\n\n", reltol, abstol);

  /* Initialize data structures */
  userdata->dx = ONE / (N - 1);         /* set spatial mesh spacing */
  u            = N_VNew_Serial(N, ctx); /* Create serial vectors */
  if (check_flag((void*)u, "N_VNew_Serial", 0)) { return 1; }
  v = N_VClone(u);
  if (check_flag((void*)v, "N_VClone", 0)) { return 1; }
  w = N_VClone(u);
  if (check_flag((void*)w, "N_VClone", 0)) { return 1; }

  /* Create manyvector for solution */
  uvw[0] = u;
  uvw[1] = v;
  uvw[2] = w;
  y      = N_VNew_ManyVector(Nvar, uvw, ctx);
  if (check_flag((void*)y, "N_VNew_ManyVector", 0)) { return 1; }

  udata = N_VGetArrayPointer(u); /* Access data array for new NVector u */
  if (check_flag((void*)udata, "N_VGetArrayPointer", 0)) { return 1; }
  vdata = N_VGetArrayPointer(v); /* Access data array for new NVector v */
  if (check_flag((void*)vdata, "N_VGetArrayPointer", 0)) { return 1; }
  wdata = N_VGetArrayPointer(w); /* Access data array for new NVector w */
  if (check_flag((void*)wdata, "N_VGetArrayPointer", 0)) { return 1; }

  /* Set initial conditions into y */
  pi = SUN_RCONST(4.0) * atan(ONE);
  for (i = 0; i < N; i++)
  {
    udata[i] = a + SUN_RCONST(0.1) * sin(pi * i * userdata->dx);     /* u */
    vdata[i] = b / a + SUN_RCONST(0.1) * sin(pi * i * userdata->dx); /* v */
    wdata[i] = b + SUN_RCONST(0.1) * sin(pi * i * userdata->dx);     /* w */
  }

  /* Call ARKStepCreate to initialize the ARK timestepper module and
     specify the right-hand side function in y'=f(t,y), the inital time
     T0, and the initial dependent variable vector y.  Note: since this
     problem is fully implicit, we set f_E to NULL and f_I to f. */
  arkode_mem = ARKStepCreate(fe, fi, T0, y, ctx);
  if (check_flag((void*)arkode_mem, "ARKStepCreate", 0)) { return 1; }

  /* Set routines */
  flag = ARKodeSetUserData(arkode_mem,
                           (void*)userdata); /* Pass udata to user functions */
  if (check_flag(&flag, "ARKodeSetUserData", 1)) { return 1; }
  flag = ARKodeSStolerances(arkode_mem, reltol, abstol); /* Specify tolerances */
  if (check_flag(&flag, "ARKodeSStolerances", 1)) { return 1; }

  /* Initialize spgmr solver */
  LS = SUNLinSol_SPGMR(y, SUN_PREC_NONE, 10, ctx);
  if (check_flag((void*)LS, "SUNLinSol_SPGMR", 0)) { return 1; }

  /* Linear solver interface */
  flag = ARKodeSetLinearSolver(arkode_mem, LS, NULL); /* Attach linear solver */
  if (check_flag(&flag, "ARKodeSetLinearSolver", 1)) { return 1; }
  flag = ARKodeSetJacTimes(arkode_mem, NULL,
                           JacVI); /* Set the Jacobian-vector product */
  if (check_flag(&flag, "ARKodeSetJacTimes", 1)) { return 1; }

  /* output spatial mesh to disk */
  FID = fopen("bruss_mesh.txt", "w");
  for (i = 0; i < N; i++)
  {
    fprintf(FID, "  %.16" ESYM "\n", userdata->dx * i);
  }
  fclose(FID);

  /* Open output streams for results, access data array */
  UFID = fopen("bruss_u.txt", "w");
  VFID = fopen("bruss_v.txt", "w");
  WFID = fopen("bruss_w.txt", "w");

  /* output initial condition to disk */
  for (i = 0; i < N; i++) { fprintf(UFID, " %.16" ESYM "", udata[i]); }
  for (i = 0; i < N; i++) { fprintf(VFID, " %.16" ESYM "", vdata[i]); }
  for (i = 0; i < N; i++) { fprintf(WFID, " %.16" ESYM "", wdata[i]); }
  fprintf(UFID, "\n");
  fprintf(VFID, "\n");
  fprintf(WFID, "\n");

  /* Main time-stepping loop: calls ARKodeEvolve to perform the integration, then
     prints results.  Stops when the final time has been reached */
  t     = T0;
  dTout = (Tf - T0) / Nt;
  tout  = T0 + dTout;
  printf("        t      ||u||_rms   ||v||_rms   ||w||_rms\n");
  printf("   ----------------------------------------------\n");
  for (iout = 0; iout < Nt; iout++)
  {
    /* call integrator */
    flag = ARKodeEvolve(arkode_mem, tout, y, &t, ARK_NORMAL);
    if (check_flag(&flag, "ARKodeEvolve", 1)) { break; }

    /* print solution statistics */
    unorm = N_VDotProd(u, u);
    unorm = sqrt(unorm / N);
    vnorm = N_VDotProd(v, v);
    vnorm = sqrt(vnorm / N);
    wnorm = N_VDotProd(w, w);
    wnorm = sqrt(wnorm / N);
    printf("  %10.6" FSYM "  %10.6" FSYM "  %10.6" FSYM "  %10.6" FSYM "\n", t,
           unorm, vnorm, wnorm);

    /* check integrator flag */
    if (flag >= 0)
    { /* successful solve: update output time */
      tout += dTout;
      tout = (tout > Tf) ? Tf : tout;
    }
    else
    { /* unsuccessful solve: break */
      fprintf(stderr, "Solver failure, stopping integration\n");
      break;
    }

    /* output results to disk */
    for (i = 0; i < N; i++) { fprintf(UFID, " %.16" ESYM "", udata[i]); }
    for (i = 0; i < N; i++) { fprintf(VFID, " %.16" ESYM "", vdata[i]); }
    for (i = 0; i < N; i++) { fprintf(WFID, " %.16" ESYM "", wdata[i]); }
    fprintf(UFID, "\n");
    fprintf(VFID, "\n");
    fprintf(WFID, "\n");
  }
  printf("   ----------------------------------------------\n");
  fclose(UFID);
  fclose(VFID);
  fclose(WFID);

  /* Print some final statistics */
  flag = ARKodeGetNumSteps(arkode_mem, &nst);
  check_flag(&flag, "ARKodeGetNumSteps", 1);
  flag = ARKodeGetNumStepAttempts(arkode_mem, &nst_a);
  check_flag(&flag, "ARKodeGetNumStepAttempts", 1);
  flag = ARKStepGetNumRhsEvals(arkode_mem, &nfe, &nfi);
  check_flag(&flag, "ARKStepGetNumRhsEvals", 1);
  flag = ARKodeGetNumLinSolvSetups(arkode_mem, &nsetups);
  check_flag(&flag, "ARKodeGetNumLinSolvSetups", 1);
  flag = ARKodeGetNumErrTestFails(arkode_mem, &netf);
  check_flag(&flag, "ARKodeGetNumErrTestFails", 1);
  flag = ARKodeGetNumNonlinSolvIters(arkode_mem, &nni);
  check_flag(&flag, "ARKodeGetNumNonlinSolvIters", 1);
  flag = ARKodeGetNumNonlinSolvConvFails(arkode_mem, &ncfn);
  check_flag(&flag, "ARKodeGetNumNonlinSolvConvFails", 1);
  flag = ARKodeGetNumLinIters(arkode_mem, &nli);
  check_flag(&flag, "ARKodeGetNumLinIters", 1);
  flag = ARKodeGetNumLinConvFails(arkode_mem, &nlcf);
  check_flag(&flag, "ARKodeGetNumLinConvFails", 1);
  flag = ARKodeGetNumJtimesEvals(arkode_mem, &nJv);
  check_flag(&flag, "ARKodeGetNumJtimesEvals", 1);
  flag = ARKodeGetNumLinRhsEvals(arkode_mem, &nfeLS);
  check_flag(&flag, "ARKodeGetNumLinRhsEvals", 1);

  printf("\nFinal Solver Statistics:\n");
  printf("   Internal solver steps = %li (attempted = %li)\n", nst, nst_a);
  printf("   Total RHS evals:  Fe = %li,  Fi = %li\n", nfe, nfi);
  printf("   Total linear solver setups = %li\n", nsetups);
  printf("   Total linear iterations = %li\n", nli);
  printf("   Total linear convergence failures = %li\n", nlcf);
  printf("   Total J*v evaluations = %li\n", nJv);
  printf("   Total RHS evals in linear solver = %li\n", nfeLS);
  printf("   Total number of Newton iterations = %li\n", nni);
  printf("   Total number of nonlinear solver convergence failures = %li\n",
         ncfn);
  printf("   Total number of error test failures = %li\n\n", netf);

  /* Clean up and return with successful completion */
  N_VDestroy(y); /* Free vectors */
  N_VDestroy(u);
  N_VDestroy(v);
  N_VDestroy(w);
  free(userdata);          /* Free user data */
  ARKodeFree(&arkode_mem); /* Free integrator memory */
  SUNLinSolFree(LS);       /* Free linear solver */
  SUNContext_Free(&ctx);   /* Free context */

  return 0;
}